

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  ImGuiTabBar *pIVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  undefined8 *puVar4;
  int iVar5;
  ImGuiTabBar *pIVar6;
  int iVar7;
  
  iVar5 = this->FreeIdx;
  if (iVar5 == (this->Buf).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Buf,iVar5 + 1);
    iVar7 = this->FreeIdx + 1;
    pIVar6 = (this->Buf).Data;
  }
  else {
    pIVar6 = (this->Buf).Data;
    iVar7 = pIVar6[iVar5].Tabs.Size;
  }
  this->FreeIdx = iVar7;
  pIVar2 = &pIVar6[iVar5].BarRect;
  (pIVar2->Min).x = 0.0;
  (pIVar2->Min).y = 0.0;
  (pIVar2->Max).x = 0.0;
  (pIVar2->Max).y = 0.0;
  pIVar1 = pIVar6 + iVar5;
  (pIVar1->Tabs).Size = 0;
  (pIVar1->Tabs).Capacity = 0;
  (pIVar1->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar1 = pIVar6 + iVar5;
  pIVar1->ID = 0;
  pIVar1->SelectedTabId = 0;
  *(undefined8 *)(&pIVar1->ID + 2) = 0;
  pIVar6[iVar5].TabsNames.Buf.Data = (char *)0x0;
  pIVar3 = &pIVar6[iVar5].FramePadding;
  pIVar3->x = 0.0;
  pIVar3->y = 0.0;
  pIVar3[1].x = 0.0;
  pIVar3[1].y = 0.0;
  pIVar6[iVar5].CurrFrameVisible = -1;
  pIVar6[iVar5].PrevFrameVisible = -1;
  pIVar1 = pIVar6 + iVar5;
  pIVar1->LastTabContentHeight = 0.0;
  pIVar1->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar1->LastTabContentHeight + 2) = 0;
  pIVar1 = pIVar6 + iVar5;
  pIVar1->ScrollingAnim = 0.0;
  pIVar1->ScrollingTarget = 0.0;
  *(undefined8 *)(&pIVar1->ScrollingAnim + 2) = 0;
  puVar4 = (undefined8 *)((long)&pIVar6[iVar5].ScrollingTargetDistToVisibility + 3);
  *puVar4 = 0;
  puVar4[1] = 0;
  pIVar6[iVar5].LastTabItemIdx = -1;
  return (this->Buf).Data + iVar5;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }